

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_MIN(Context *ctx)

{
  size_t in_R8;
  char src1 [64];
  char src0 [64];
  char code [128];
  char acStack_128 [64];
  char local_e8 [64];
  char local_a8 [136];
  
  make_METAL_srcarg_string(ctx,0,(ctx->dest_arg).writemask,local_e8,in_R8);
  make_METAL_srcarg_string(ctx,1,(ctx->dest_arg).writemask,acStack_128,in_R8);
  ctx->metal_need_header_math = 1;
  make_METAL_destarg_assign(ctx,local_a8,0x80,"min(%s, %s)",local_e8,acStack_128);
  output_line(ctx,"%s",local_a8);
  return;
}

Assistant:

static void emit_METAL_MIN(Context *ctx)
{
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char code[128];
    ctx->metal_need_header_math = 1;
    make_METAL_destarg_assign(ctx, code, sizeof (code), "min(%s, %s)", src0, src1);
    output_line(ctx, "%s", code);
}